

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  size_type sVar2;
  pointer pbVar3;
  void *pvVar4;
  MatchResultListener *pMVar5;
  ulong uVar6;
  pointer pcVar7;
  long *plVar8;
  ulong uVar9;
  pointer pcVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  size_type __n;
  long lVar15;
  bool bVar16;
  char *sep;
  vector<char,_std::allocator<char>_> element_matched;
  vector<char,_std::allocator<char>_> matcher_matched;
  char *local_78;
  vector<char,_std::allocator<char>_> local_70;
  char *local_58;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  __n = *(size_type *)matrix;
  sVar2 = *(size_type *)(matrix + 8);
  bVar14 = true;
  if (__n != 0 || sVar2 != 0) {
    bVar14 = __n == sVar2 || *(int *)this != 3;
    local_38 = element_printouts;
    if (__n != 0 && (__n != sVar2 && *(int *)this == 3)) {
      if (listener->stream_ != (ostream *)0x0) {
        pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
        Elements((UnorderedElementsAreMatcherImplBase *)&local_70,*(size_t *)matrix);
        pMVar5 = MatchResultListener::operator<<(pMVar5,(Message *)&local_70);
        MatchResultListener::operator<<(pMVar5,(char (*) [2])0x14b538);
        if ((long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          (**(code **)(*(long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
        __n = *(size_type *)matrix;
      }
      bVar14 = false;
    }
    local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              (&local_70,__n,(value_type *)&local_50,(allocator_type *)&local_78);
    local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_50,*(size_type *)(matrix + 8),(value_type *)&local_78,
               (allocator_type *)&local_58);
    uVar13 = *(ulong *)matrix;
    if (uVar13 != 0) {
      uVar9 = *(ulong *)(matrix + 8);
      uVar6 = 0;
      do {
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          uVar13 = 0;
          do {
            bVar16 = *(char *)(uVar13 + uVar9 * uVar6 + *(long *)(matrix + 0x10)) == '\x01';
            *(byte *)((long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar6) =
                 *(byte *)((long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar6) | bVar16;
            pbVar1 = (byte *)(CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar13);
            *pbVar1 = *pbVar1 | bVar16;
            uVar13 = uVar13 + 1;
            uVar9 = *(ulong *)(matrix + 8);
          } while (uVar13 < uVar9);
          uVar13 = *(ulong *)matrix;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar13);
    }
    uVar12 = *(uint *)this;
    if ((uVar12 & 1) != 0) {
      local_78 = "where the following matchers don\'t match any elements:\n";
      pcVar7 = (pointer)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_1_);
      if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish != pcVar7) {
        uVar13 = 0;
        pcVar10 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (pcVar7[uVar13] == '\0') {
            if (listener->stream_ != (ostream *)0x0) {
              pMVar5 = MatchResultListener::operator<<(listener,&local_78);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x14d929);
              if (pMVar5->stream_ != (ostream *)0x0) {
                std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
              }
              MatchResultListener::operator<<(pMVar5,(char (*) [3])0x14b8cf);
              plVar8 = *(long **)(*(long *)(this + 8) + uVar13 * 8);
              (**(code **)(*plVar8 + 0x10))(plVar8,listener->stream_);
              local_78 = ",\n";
              pcVar7 = (pointer)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_1_);
              pcVar10 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            bVar14 = false;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)((long)pcVar10 - (long)pcVar7));
        uVar12 = *(uint *)this;
      }
    }
    if ((uVar12 & 2) != 0) {
      local_78 = "where the following elements don\'t match any matchers:\n";
      local_58 = "\nand ";
      if (bVar14) {
        local_58 = "";
      }
      if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar15 = 8;
        uVar13 = 0;
        plVar8 = (long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        plVar11 = (long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        do {
          if (*(char *)((long)plVar8 + uVar13) == '\0') {
            if (listener->stream_ != (ostream *)0x0) {
              pMVar5 = MatchResultListener::operator<<(listener,&local_58);
              pMVar5 = MatchResultListener::operator<<(pMVar5,&local_78);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x14d6df);
              if (pMVar5->stream_ != (ostream *)0x0) {
                std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
              }
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x14b8cf);
              if (pMVar5->stream_ != (ostream *)0x0) {
                pbVar3 = (local_38->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pMVar5->stream_,*(char **)((long)pbVar3 + lVar15 + -8),
                           *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar15));
              }
              local_78 = ",\n";
              local_58 = "";
              plVar8 = (long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start;
              plVar11 = (long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish;
            }
            bVar14 = false;
          }
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar13 < (ulong)((long)plVar11 - (long)plVar8));
      }
    }
    pvVar4 = (void *)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
    }
    if ((long *)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar14;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  const bool is_exact_match_with_size_discrepency =
      match_flags() == UnorderedMatcherRequire::ExactMatch &&
      matrix.LhsSize() != matrix.RhsSize();
  if (is_exact_match_with_size_discrepency) {
    // The element count doesn't match.  If the container is empty,
    // there's no need to explain anything as Google Mock already
    // prints the empty container. Otherwise we just need to show
    // how many elements there actually are.
    if (matrix.LhsSize() != 0 && listener->IsInterested()) {
      *listener << "which has " << Elements(matrix.LhsSize()) << "\n";
    }
  }

  bool result = !is_exact_match_with_size_discrepency;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}